

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  byte bVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  MessageLite *pMVar8;
  ushort *p_00;
  undefined4 extraout_var;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  uint uVar12;
  uint32_t res;
  ParseContext *pPVar13;
  uint uVar14;
  ParseContext *this_00;
  ExtensionInfo *extension_00;
  uint field_number;
  ushort *unaff_R13;
  ushort *puVar15;
  ushort *puVar16;
  bool bVar17;
  pair<const_char_*,_int> pVar18;
  pair<const_char_*,_unsigned_int> pVar19;
  StringPiece val;
  bool was_packed_on_wire;
  string payload;
  char *p;
  ExtensionInfo extension;
  ParseContext tmp_ctx;
  ushort *local_130;
  uint local_128;
  bool local_121;
  ExtensionSet *local_120;
  InternalMetadata *local_118;
  MessageLite *local_110;
  ParseContext *local_108;
  string local_100;
  undefined **local_e0;
  char *local_d8;
  ExtensionInfo local_d0;
  ParseContext local_a8;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_e0 = &PTR__ExtensionFinder_004e49e0;
  local_128 = 0;
  field_number = 0;
  local_130 = (ushort *)ptr;
  local_120 = this;
  local_118 = metadata;
  local_110 = extendee;
  do {
    this_00 = ctx;
    bVar6 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_130,ctx->group_depth_);
    puVar16 = local_130;
    if (bVar6) break;
    p_00 = (ushort *)((long)local_130 + 1);
    puVar15 = unaff_R13;
    if ((byte)*local_130 == 0x1a) {
      if (field_number == 0) {
        bVar1 = *(byte *)p_00;
        if ((char)bVar1 < '\0') {
          local_130 = p_00;
          pVar18 = ReadSizeFallback((char *)p_00,(uint)bVar1);
          auVar2 = pVar18._0_12_;
        }
        else {
          auVar2[8] = bVar1;
          auVar2._0_8_ = local_130 + 1;
          auVar2._9_3_ = 0;
        }
        local_130 = auVar2._0_8_;
        field_number = 0;
        if (local_130 == (ushort *)0x0) {
          bVar6 = false;
          local_130 = (ushort *)0x0;
          puVar15 = (ushort *)0x0;
        }
        else {
          local_130 = (ushort *)
                      EpsCopyInputStream::ReadString
                                (&ctx->super_EpsCopyInputStream,(char *)local_130,auVar2._8_4_,
                                 &local_100);
          bVar6 = local_130 != (ushort *)0x0;
          local_128 = local_128 & 0xff;
          puVar15 = local_130;
          if (bVar6) {
            local_128 = 1;
            puVar15 = unaff_R13;
          }
        }
        bVar17 = false;
        unaff_R13 = puVar15;
        if (bVar6) goto LAB_003df433;
      }
      else {
        local_130 = p_00;
        local_130 = (ushort *)
                    ParseField(local_120,(ulong)field_number * 8 + 2,(char *)p_00,local_110,
                               local_118,ctx);
        if (local_130 != (ushort *)0x0) {
          field_number = 0;
          goto LAB_003df433;
        }
LAB_003df37b:
        bVar17 = false;
        unaff_R13 = (ushort *)0x0;
      }
    }
    else if ((byte)*local_130 == 0x10) {
      uVar12 = (uint)(char)*p_00;
      uVar9 = *p_00 + uVar12;
      uVar14 = uVar12 * 2 & uVar9;
      pPVar13 = (ParseContext *)(ulong)(uVar14 >> 1);
      if ((short)uVar14 < 0) {
        local_130 = (ushort *)((long)local_130 + 3);
        lVar11 = 0xd;
        do {
          this_00 = pPVar13;
          uVar12 = (uint)(char)*local_130;
          uVar9 = *local_130 + uVar12;
          uVar14 = uVar12 * 2 & uVar9;
          pPVar13 = (ParseContext *)
                    ((this_00->super_EpsCopyInputStream).buffer_ +
                    ((ulong)uVar14 - 2 << ((byte)lVar11 & 0x3f)) + -0x28);
          if (-1 < (short)uVar14) {
            local_130 = (ushort *)((long)local_130 + (ulong)(uVar9 < uVar12) + 1);
            goto LAB_003df15a;
          }
          lVar11 = lVar11 + 0xe;
          local_130 = local_130 + 1;
        } while (lVar11 != 0x45);
        local_130 = (ushort *)0x0;
        pPVar13 = local_108;
      }
      else {
        local_130 = (ushort *)((long)local_130 + (ulong)(uVar9 < uVar12) + 2);
      }
LAB_003df15a:
      if (local_130 == (ushort *)0x0) {
        bVar6 = false;
        puVar15 = (ushort *)0x0;
      }
      else {
        bVar6 = true;
        field_number = (uint)pPVar13;
        if ((local_128 & 1) != 0) {
          local_d0.number = 0;
          local_d0.type = '\0';
          local_d0.is_repeated = false;
          local_d0.is_packed = false;
          local_d0.message._0_7_ = 0;
          local_d0.message._7_1_ = 0;
          local_d0.descriptor = (FieldDescriptor *)0x0;
          local_d0.field_5.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
          local_d0.field_5.enum_validity_check.arg = (void *)0x0;
          local_a8.super_EpsCopyInputStream.limit_end_ = (char *)local_e0;
          local_a8.super_EpsCopyInputStream.buffer_end_ = (char *)local_110;
          extension_00 = &local_d0;
          bVar6 = FindExtensionInfoFromFieldNumber
                            ((ExtensionSet *)this_00,2,field_number,(ExtensionFinder *)&local_a8,
                             extension_00,&local_121);
          sVar5 = local_100._M_string_length;
          _Var4._M_p = local_100._M_dataplus._M_p;
          if (bVar6) {
            if (local_d0.is_repeated == true) {
              pMVar8 = AddMessage(local_120,field_number,'\v',
                                  (MessageLite *)local_d0.field_5.enum_validity_check.func,
                                  local_d0.descriptor);
            }
            else {
              pMVar8 = MutableMessage(local_120,field_number,'\v',
                                      (MessageLite *)local_d0.field_5.enum_validity_check.func,
                                      local_d0.descriptor);
            }
            ParseContext::ParseContext<std::__cxx11::string&>
                      (&local_a8,ctx->depth_,false,&local_d8,&local_100);
            local_a8.data_.pool = (ctx->data_).pool;
            local_a8.data_.factory = (ctx->data_).factory;
            iVar7 = (*pMVar8->_vptr_MessageLite[10])(pMVar8,local_d8,&local_a8);
            bVar17 = CONCAT44(extraout_var,iVar7) != 0;
            bVar6 = local_a8.super_EpsCopyInputStream.last_tag_minus_1_ == 0 && bVar17;
            if (local_a8.super_EpsCopyInputStream.last_tag_minus_1_ == 0 && bVar17) {
              field_number = 0;
            }
            else {
              puVar15 = (ushort *)0x0;
            }
          }
          else {
            if ((long)local_100._M_string_length < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (local_100._M_string_length,"string length exceeds max size");
            }
            if ((local_118->ptr_ & 1U) == 0) {
              pbVar10 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
                                  (local_118);
            }
            else {
              pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((local_118->ptr_ & 0xfffffffffffffffcU) + 8);
            }
            val.length_ = (size_type)pbVar10;
            val.ptr_ = (char *)sVar5;
            WriteLengthDelimited
                      ((internal *)((ulong)pPVar13 & 0xffffffff),(uint32_t)_Var4._M_p,val,
                       (string *)extension_00);
            field_number = 0;
            bVar6 = true;
          }
        }
      }
      local_108 = pPVar13;
      if (bVar6) {
LAB_003df433:
        bVar17 = true;
        unaff_R13 = puVar15;
      }
      else {
        bVar17 = false;
        unaff_R13 = puVar15;
      }
    }
    else {
      bVar1 = (byte)*local_130;
      uVar9 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*(byte *)p_00 * 0x80) - 0x80;
        if ((char)*(byte *)p_00 < '\0') {
          local_130 = p_00;
          pVar19 = ReadTagFallback((char *)puVar16,res);
          auVar3 = pVar19._0_12_;
        }
        else {
          auVar3._8_4_ = res;
          auVar3._0_8_ = local_130 + 1;
        }
        uVar9 = auVar3._8_4_;
        p_00 = auVar3._0_8_;
      }
      local_130 = p_00;
      if (uVar9 != 0 && (uVar9 & 7) != 4) {
        local_130 = (ushort *)
                    ParseField(local_120,(ulong)uVar9,(char *)p_00,local_110,local_118,ctx);
        if (local_130 == (ushort *)0x0) goto LAB_003df37b;
        goto LAB_003df433;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
      bVar17 = false;
      unaff_R13 = p_00;
    }
    puVar16 = unaff_R13;
  } while (bVar17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  return (char *)puVar16;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  bool payload_read = false;
  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (payload_read) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        payload_read = true;
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}